

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::MaybeScheduleCompaction(DBImpl *this)

{
  bool bVar1;
  DBImpl *this_local;
  
  port::Mutex::AssertHeld(&this->mutex_);
  if (((((this->background_compaction_scheduled_ & 1U) == 0) &&
       (bVar1 = std::atomic<bool>::load(&this->shutting_down_,memory_order_acquire), !bVar1)) &&
      (bVar1 = Status::ok(&this->bg_error_), bVar1)) &&
     (((this->imm_ != (MemTable *)0x0 || (this->manual_compaction_ != (ManualCompaction *)0x0)) ||
      (bVar1 = VersionSet::NeedsCompaction(this->versions_), bVar1)))) {
    this->background_compaction_scheduled_ = true;
    (*this->env_->_vptr_Env[0xf])(this->env_,BGWork);
  }
  return;
}

Assistant:

void DBImpl::MaybeScheduleCompaction() {
  mutex_.AssertHeld();
  if (background_compaction_scheduled_) {
    // Already scheduled
  } else if (shutting_down_.load(std::memory_order_acquire)) {
    // DB is being deleted; no more background compactions
  } else if (!bg_error_.ok()) {
    // Already got an error; no more changes
  } else if (imm_ == nullptr && manual_compaction_ == nullptr &&
             !versions_->NeedsCompaction()) {
    // No work to be done
  } else {
    background_compaction_scheduled_ = true;
    env_->Schedule(&DBImpl::BGWork, this);
  }
}